

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Type * __thiscall soul::heart::Parser::readValueType(Type *__return_storage_ptr__,Parser *this)

{
  SourceCodeText *o;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  StructurePtr s;
  Type t;
  CodeLocation errorPos;
  string name;
  undefined1 local_128 [12];
  Primitive local_11c;
  UTF8Reader local_118;
  Ptr local_110;
  CodeLocation local_108;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  Structure *local_c8;
  CompileMessage local_c0;
  CompileMessage local_88;
  CompileMessage local_50;
  
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_108.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_108.sourceCode.object = o;
  readPrimitiveValueType((Type *)(local_128 + 8),this);
  if (local_11c - complex32 < 2) {
    CompileMessageHelpers::createMessage<char_const(&)[8]>
              (&local_50,(CompileMessageHelpers *)0x1,none,0x27e09f,"complex",(char (*) [8])in_R9);
    CodeLocation::throwError(&local_108,&local_50);
  }
  if (local_11c == fixed) {
    CompileMessageHelpers::createMessage<char_const(&)[6]>
              (&local_88,(CompileMessageHelpers *)0x1,none,0x27e09f,"fixed",(char (*) [6])in_R9);
    CodeLocation::throwError(&local_108,&local_88);
  }
  if (local_128[8] == '\0') {
    readQualifiedGeneralIdentifier_abi_cxx11_(&local_f8,this);
    findStruct((Parser *)local_128,(string *)this);
    if ((Structure *)local_128._0_8_ == (Structure *)0x0) {
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)0x0);
      CompileMessageHelpers::createMessage<std::__cxx11::string&>
                (&local_c0,(CompileMessageHelpers *)0x1,none,0x2a3792,(char *)&local_f8,in_R9);
      CodeLocation::throwError(&local_108,&local_c0);
    }
    local_d8._M_local_buf[0] = '\x06';
    local_d8._M_allocated_capacity._1_7_ = 0;
    local_d8._M_local_buf[8] = '\0';
    local_d8._9_7_ = 0;
    local_c8 = (Structure *)local_128._0_8_;
    ((RefCountedObject *)local_128._0_8_)->refCount =
         ((RefCountedObject *)local_128._0_8_)->refCount + 1;
    parseArrayTypeSuffixes(__return_storage_ptr__,this,(Type *)&local_d8);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_c8);
    RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_128._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    __return_storage_ptr__->category = local_128[8];
    __return_storage_ptr__->arrayElementCategory = local_128[9];
    __return_storage_ptr__->isRef = (bool)local_128[10];
    __return_storage_ptr__->isConstant = (bool)local_128[0xb];
    (__return_storage_ptr__->primitiveType).type = local_11c;
    *(char **)&__return_storage_ptr__->boundingSize = local_118.data;
    (__return_storage_ptr__->structure).object = (Structure *)local_110.object;
    local_110.object = (SourceCodeText *)0x0;
  }
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_110.object);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return __return_storage_ptr__;
}

Assistant:

Type readValueType()
    {
        auto errorPos = location;
        auto t = readPrimitiveValueType();

        if (t.isComplex())  errorPos.throwError (Errors::notYetImplemented ("complex"));
        if (t.isFixed())    errorPos.throwError (Errors::notYetImplemented ("fixed"));

        if (t.isValid())
            return t;

        auto name = readQualifiedGeneralIdentifier();

        if (auto s = findStruct (name))
            return parseArrayTypeSuffixes (Type::createStruct (*s));

        errorPos.throwError (Errors::unresolvedType (name));
    }